

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O1

void __thiscall ImgfsFile::nameinfo::getdata(nameinfo *this,uint8_t *p,ImgfsFile *imgfs)

{
  ushort uVar1;
  ulong uVar2;
  ulong uVar3;
  pointer pcVar4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  bool bVar7;
  uint16_t uVar8;
  uint32_t uVar9;
  undefined8 *puVar10;
  int iVar11;
  uint size;
  Wstring wstr;
  NameEntry ent;
  Wstring local_a8;
  undefined1 local_88 [16];
  anon_union_16_2_edb7204a_for_basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>_11
  aStack_78;
  long *local_68 [2];
  long local_58 [2];
  string local_48;
  
  uVar1 = this->_length;
  iVar11 = 0;
  if (uVar1 >= 5) {
    iVar11 = 2 - (uint)(uVar1 < 0x19);
  }
  uVar2 = (this->_name)._M_string_length;
  bVar7 = uVar1 < 5;
  if (4 < uVar2) {
    bVar7 = 2 - (uint)(uVar2 < 0x19) == iVar11;
  }
  if (!bVar7) {
    if (iVar11 == 2) {
      freechunk(imgfs,(ulong)this->_ptr,((imgfs->_hdr).bytesperchunk - 1 | (uint)uVar1 * 2 - 1) + 1)
      ;
    }
    else if (iVar11 == 1) {
      freeent(imgfs,(ulong)this->_ptr);
    }
    this->_ptr = 0;
  }
  uVar3 = (this->_name)._M_string_length;
  if (uVar3 < 0x10000) {
    uVar8 = (uint16_t)uVar3;
    this->_length = uVar8;
    *(uint16_t *)p = uVar8;
    if (uVar2 < 5) {
      *(uint16_t *)(p + 2) = this->_flags;
      ToWString<char>((Wstring *)local_88,&this->_name);
      p[4] = '\0';
      p[5] = '\0';
      p[6] = '\0';
      p[7] = '\0';
      p[8] = '\0';
      p[9] = '\0';
      p[10] = '\0';
      p[0xb] = '\0';
      if (local_88._8_8_ != 0) {
        memmove(p + 4,(void *)local_88._0_8_,local_88._8_8_ * 2);
      }
      if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
        operator_delete((void *)local_88._0_8_,aStack_78._M_allocated_capacity * 2 + 2);
      }
    }
    else {
      if (this->_ptr == 0) {
        ToWString<char>(&local_a8,&this->_name);
        if (uVar2 - 5 < 0x14) {
          *(byte *)&this->_flags = (byte)this->_flags | 2;
          local_88._8_8_ = 0;
          aStack_78._M_allocated_capacity = 0;
          aStack_78._8_4_ = 0;
          aStack_78._12_4_ = 0;
          local_88._0_8_ = &PTR__NameEntry_001471c8;
          pcVar4 = (this->_name)._M_dataplus._M_p;
          local_68[0] = local_58;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_68,pcVar4,pcVar4 + (this->_name)._M_string_length);
          aStack_78._M_allocated_capacity._0_4_ = 0xfffffefb;
          DirEntry::save((DirEntry *)local_88,imgfs);
          uVar9 = DirEntry::offset((DirEntry *)local_88);
          this->_ptr = uVar9;
          local_88._0_8_ = &PTR__NameEntry_001471c8;
          if (local_68[0] != local_58) {
            operator_delete(local_68[0],local_58[0] + 1);
          }
        }
        else {
          size = ((imgfs->_hdr).bytesperchunk - 1 | (int)local_a8._M_string_length * 2 - 1U) + 1;
          uVar9 = allocchunk(imgfs,size,NAMECHUNK);
          this->_ptr = uVar9;
          std::__cxx11::
          basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
          ::resize(&local_a8,(ulong)(size >> 1),0);
          peVar5 = (imgfs->_rd).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          p_Var6 = (imgfs->_rd).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
          if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
            }
          }
          (*peVar5->_vptr_ReadWriter[4])(peVar5,(ulong)this->_ptr);
          if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
          }
          peVar5 = (imgfs->_rd).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          p_Var6 = (imgfs->_rd).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
          if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
            }
          }
          (*peVar5->_vptr_ReadWriter[3])(peVar5,local_a8._M_dataplus._M_p,(ulong)size);
          if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity * 2 + 2);
        }
      }
      pcVar4 = (this->_name)._M_dataplus._M_p;
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_48,pcVar4,pcVar4 + (this->_name)._M_string_length);
      uVar9 = calc_name_hash(&local_48);
      this->_hash = uVar9;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      *(uint16_t *)(p + 2) = this->_flags;
      *(uint32_t *)(p + 4) = this->_hash;
      *(uint32_t *)(p + 8) = this->_ptr;
    }
    return;
  }
  puVar10 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar10 = "filename too long";
  __cxa_throw(puVar10,&char_const*::typeinfo,0);
}

Assistant:

void getdata(uint8_t *p, ImgfsFile& imgfs)
        {
            int oldtype= nametype(_length);
            int newtype= nametype(_name.size());

            // first free resources
            if (oldtype!=newtype) {
                if (oldtype==IN_NAME_ENTRY)
                    imgfs.freeent(_ptr);
                else if (oldtype==IN_NAME_CHUNK)
                    imgfs.freechunk(_ptr, imgfs.roundtochunk(_length*sizeof(WCHAR)));
                _ptr= 0;
            }
            if (_name.size()>=0x10000)
                throw "filename too long";
            _length= (uint16_t)_name.size();
            set16le(p, _length);
            if (newtype==IN_DIR_ENTRY) {
                set16le(p+2, _flags);
                std::Wstring wstr= ToWString(_name);
                std::fill_n((WCHAR*)(p+4), 4, WCHAR(0));
                // note: nonportable endian cast
                std::copy(wstr.begin(), wstr.end(), (WCHAR*)(p+4));
            }
            else {
                if (_ptr==0) {
                    std::Wstring wstr= ToWString(_name);
                    if (newtype==IN_NAME_ENTRY)
                    {
                        _flags|= 2;
                        NameEntry ent(_name);
                        ent.save(imgfs);
                        _ptr= ent.offset();
                    }
                    else {
                        size_t rounded= imgfs.roundtochunk(wstr.size()*sizeof(WCHAR));
                        // alloc chunk
                        _ptr= imgfs.allocchunk(rounded, NAMECHUNK);

                        wstr.resize(rounded/sizeof(WCHAR));
                        imgfs.rd()->setpos(_ptr);
                        //printf("nameinfo: getdata(%08x)\n", _ptr);
                        imgfs.rd()->write((const uint8_t*)wstr.c_str(), rounded);
                    }
                }
                _hash= calc_name_hash(_name);
                set16le(p+2, _flags);
                set32le(p+4, _hash);
                set32le(p+8, _ptr);
            }
        }